

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_insert.cpp
# Opt level: O2

SinkResultType __thiscall
duckdb::PhysicalBatchInsert::Sink
          (PhysicalBatchInsert *this,ExecutionContext *context,DataChunk *insert_chunk,
          OperatorSinkInput *input)

{
  GlobalSinkState *gstate_p;
  BatchInsertLocalState *pBVar1;
  DuckTableEntry *table_entry;
  ExecutionContext *pEVar2;
  mutex_type *pmVar3;
  bool bVar4;
  SinkResultType SVar5;
  int iVar6;
  int iVar7;
  idx_t batch_index;
  idx_t current_min_batch_index;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  LocalStorage *this_00;
  undefined4 extraout_var_02;
  optional_ptr<duckdb::LocalTableStorage,_true> storage;
  type constraint_state;
  undefined4 extraout_var_03;
  RowGroupCollection *this_01;
  pointer this_02;
  InternalException *this_03;
  pointer *__mutex;
  BatchMemoryManager *this_04;
  allocator local_79;
  BatchInsertLocalState *local_78;
  PhysicalBatchInsert *local_70;
  ExecutionContext *local_68;
  unique_lock<std::mutex> guard;
  
  gstate_p = input->global_state;
  pBVar1 = (BatchInsertLocalState *)input->local_state;
  table_entry = (DuckTableEntry *)
                gstate_p[4].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__align;
  local_70 = this;
  local_68 = context;
  DataChunk::Flatten(insert_chunk);
  batch_index = optional_idx::GetIndex(&(pBVar1->super_LocalSinkState).partition_info.batch_index);
  if (*(ulong *)&gstate_p[2].super_StateWithBlockableTasks < batch_index) {
    this_04 = (BatchMemoryManager *)(gstate_p + 1);
    current_min_batch_index =
         optional_idx::GetIndex(&(pBVar1->super_LocalSinkState).partition_info.min_batch_index);
    BatchMemoryManager::UpdateMinBatchIndex(this_04,current_min_batch_index);
    bVar4 = BatchMemoryManager::OutOfMemory(this_04,batch_index);
    if (bVar4) {
      ExecuteTasks(local_70,local_68->client,gstate_p,(LocalSinkState *)pBVar1);
      ::std::unique_lock<std::mutex>::unique_lock
                (&guard,(mutex_type *)&gstate_p[1].super_StateWithBlockableTasks);
      local_78 = *(BatchInsertLocalState **)&gstate_p[2].super_StateWithBlockableTasks;
      if (local_78 < batch_index) {
        SVar5 = StateWithBlockableTasks::BlockSink
                          ((StateWithBlockableTasks *)this_04,&guard,input->interrupt_state);
        this_04 = (BatchMemoryManager *)(ulong)SVar5;
      }
      ::std::unique_lock<std::mutex>::~unique_lock(&guard);
      if (local_78 < batch_index) {
        return (SinkResultType)this_04;
      }
    }
  }
  if ((pBVar1->collection_index).index == 0xffffffffffffffff) {
    __mutex = &gstate_p[3].super_StateWithBlockableTasks.blocked_tasks.
               super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
               super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    ::std::mutex::lock((mutex *)__mutex);
    BatchInsertLocalState::CreateNewCollection
              (pBVar1,local_68->client,table_entry,&local_70->insert_types);
    if ((pBVar1->optimistic_writer).
        super_unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::OptimisticDataWriter_*,_std::default_delete<duckdb::OptimisticDataWriter>_>
        .super__Head_base<0UL,_duckdb::OptimisticDataWriter_*,_false>._M_head_impl ==
        (OptimisticDataWriter *)0x0) {
      iVar6 = (*(table_entry->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
                super_CatalogEntry._vptr_CatalogEntry[0x10])(table_entry);
      make_uniq<duckdb::OptimisticDataWriter,duckdb::DataTable&>
                ((duckdb *)&guard,(DataTable *)CONCAT44(extraout_var,iVar6));
      pmVar3 = guard._M_device;
      guard._M_device = (mutex_type *)0x0;
      ::std::
      __uniq_ptr_impl<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>_>
      ::reset((__uniq_ptr_impl<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>_>
               *)&pBVar1->optimistic_writer,(pointer)pmVar3);
      ::std::
      unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>_>::
      ~unique_ptr((unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>_>
                   *)&guard);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  if (pBVar1->current_index == batch_index) {
    local_78 = pBVar1;
    if ((pBVar1->constraint_state).
        super_unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>.
        _M_t.
        super___uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::ConstraintState_*,_std::default_delete<duckdb::ConstraintState>_>
        .super__Head_base<0UL,_duckdb::ConstraintState_*,_false>._M_head_impl ==
        (ConstraintState *)0x0) {
      iVar6 = (*(table_entry->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
                super_CatalogEntry._vptr_CatalogEntry[0x10])(table_entry);
      DataTable::InitializeConstraintState
                ((DataTable *)&guard,(TableCatalogEntry *)CONCAT44(extraout_var_00,iVar6),
                 (vector<duckdb::unique_ptr<duckdb::BoundConstraint,_std::default_delete<duckdb::BoundConstraint>,_true>,_true>
                  *)table_entry);
      pmVar3 = guard._M_device;
      guard._M_device = (mutex_type *)0x0;
      ::std::__uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>
      ::reset((__uniq_ptr_impl<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>
               *)&pBVar1->constraint_state,(pointer)pmVar3);
      ::std::unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>::
      ~unique_ptr((unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>_>
                   *)&guard);
    }
    iVar6 = (*(table_entry->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
              super_CatalogEntry._vptr_CatalogEntry[0x10])(table_entry);
    pEVar2 = local_68;
    this_00 = LocalStorage::Get(local_68->client,((DataTable *)CONCAT44(extraout_var_01,iVar6))->db)
    ;
    iVar7 = (*(table_entry->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
              super_CatalogEntry._vptr_CatalogEntry[0x10])(table_entry);
    storage = LocalStorage::GetStorage(this_00,(DataTable *)CONCAT44(extraout_var_02,iVar7));
    constraint_state =
         unique_ptr<duckdb::ConstraintState,_std::default_delete<duckdb::ConstraintState>,_true>::
         operator*(&pBVar1->constraint_state);
    DataTable::VerifyAppendConstraints
              ((DataTable *)CONCAT44(extraout_var_01,iVar6),constraint_state,pEVar2->client,
               insert_chunk,storage,(optional_ptr<duckdb::ConflictManager,_true>)0x0);
    iVar6 = (*(table_entry->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
              super_CatalogEntry._vptr_CatalogEntry[0x10])(table_entry);
    pBVar1 = local_78;
    this_01 = DataTable::GetOptimisticCollection
                        ((DataTable *)CONCAT44(extraout_var_03,iVar6),pEVar2->client,
                         (PhysicalIndex)(local_78->collection_index).index);
    bVar4 = RowGroupCollection::Append(this_01,insert_chunk,&pBVar1->current_append_state);
    if (bVar4) {
      this_02 = unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>,_true>
                ::operator->(&pBVar1->optimistic_writer);
      OptimisticDataWriter::WriteNewRowGroup(this_02,this_01);
    }
    return NEED_MORE_INPUT;
  }
  this_03 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&guard,"Current batch differs from batch - but NextBatch was not called!?",
             &local_79);
  InternalException::InternalException(this_03,(string *)&guard);
  __cxa_throw(this_03,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

SinkResultType PhysicalBatchInsert::Sink(ExecutionContext &context, DataChunk &insert_chunk,
                                         OperatorSinkInput &input) const {
	auto &gstate = input.global_state.Cast<BatchInsertGlobalState>();
	auto &lstate = input.local_state.Cast<BatchInsertLocalState>();
	auto &memory_manager = gstate.memory_manager;

	auto &table = gstate.table;
	insert_chunk.Flatten();

	auto batch_index = lstate.partition_info.batch_index.GetIndex();
	// check if we should process this batch
	if (!memory_manager.IsMinimumBatchIndex(batch_index)) {
		memory_manager.UpdateMinBatchIndex(lstate.partition_info.min_batch_index.GetIndex());

		// we are not processing the current min batch index
		// check if we have exceeded the maximum number of unflushed rows
		if (memory_manager.OutOfMemory(batch_index)) {
			// out-of-memory
			// execute tasks while we wait (if any are available)
			ExecuteTasks(context.client, gstate, lstate);

			auto guard = memory_manager.Lock();
			if (!memory_manager.IsMinimumBatchIndex(batch_index)) {
				//  we are not the minimum batch index and we have no memory available to buffer - block the task for
				//  now
				return memory_manager.BlockSink(guard, input.interrupt_state);
			}
		}
	}
	if (!lstate.collection_index.IsValid()) {
		lock_guard<mutex> l(gstate.lock);
		// no collection yet: create a new one
		lstate.CreateNewCollection(context.client, table, insert_types);
		if (!lstate.optimistic_writer) {
			lstate.optimistic_writer = make_uniq<OptimisticDataWriter>(table.GetStorage());
		}
	}

	if (lstate.current_index != batch_index) {
		throw InternalException("Current batch differs from batch - but NextBatch was not called!?");
	}

	if (!lstate.constraint_state) {
		lstate.constraint_state = table.GetStorage().InitializeConstraintState(table, bound_constraints);
	}

	auto &storage = table.GetStorage();
	auto &local_storage = LocalStorage::Get(context.client, storage.db);
	auto local_table_storage = local_storage.GetStorage(table.GetStorage());
	storage.VerifyAppendConstraints(*lstate.constraint_state, context.client, insert_chunk, local_table_storage,
	                                nullptr);

	auto &collection = table.GetStorage().GetOptimisticCollection(context.client, lstate.collection_index);
	auto new_row_group = collection.Append(insert_chunk, lstate.current_append_state);
	if (new_row_group) {
		// we have already written to disk - flush the next row group as well
		lstate.optimistic_writer->WriteNewRowGroup(collection);
	}
	return SinkResultType::NEED_MORE_INPUT;
}